

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O3

void __thiscall
burst::detail::
join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::join_iterator_impl
          (join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this,undefined8 *param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
  *piVar3;
  
  (this->m_begin).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)*param_2;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_2[1];
  (this->m_begin).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_begin).m_iterator._M_current =
       (iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
        *)param_2[2];
  peVar2 = (element_type *)param_2[3];
  (this->m_end).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_2[4];
  (this->m_end).m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->m_end).m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  piVar3 = (iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
            *)param_2[5];
  (this->m_end).m_iterator._M_current = piVar3;
  if ((this->m_begin).m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != peVar2) {
LAB_001e4fd9:
    __assert_fail("this->m_container == that.m_container",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/owning_iterator.hpp"
                  ,0x55,
                  "bool burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_Deque_iterator<int, int &, int *>>>>>::equal(const owning_iterator<Container> &) const [Container = std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, std::_Deque_iterator<int, int &, int *>>>>]"
                 );
  }
  if ((this->m_begin).m_iterator._M_current == piVar3) {
    (this->m_outer).m_container.
    super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->m_outer).m_container.
    super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_outer).m_iterator._M_current =
         (iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>
          *)0x0;
  }
  else {
    (this->m_outer).m_container.
    super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    p_Var1 = (this->m_end).m_container.
             super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->m_outer).m_container.
    super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        peVar2 = (this->m_begin).m_container.
                 super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar3 = (this->m_end).m_iterator._M_current;
        (this->m_outer).m_iterator._M_current = piVar3;
        if (peVar2 != (this->m_end).m_container.
                      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr) goto LAB_001e4fd9;
        goto LAB_001e4f50;
      }
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
    (this->m_outer).m_iterator._M_current = piVar3;
  }
LAB_001e4f50:
  if ((this->m_begin).m_iterator._M_current == piVar3) {
    *(undefined8 *)
     ((long)&(this->m_inner).m_iterator.storage_.super_aligned_storage_imp<32UL,_8UL>.data_ + 8) = 0
    ;
    *(undefined8 *)
     ((long)&(this->m_inner).m_iterator.storage_.super_aligned_storage_imp<32UL,_8UL>.data_ + 0x10)
         = 0;
    *(undefined8 *)&(this->m_inner).m_iterator = 0;
    (this->m_inner).m_iterator.storage_.super_aligned_storage_imp<32UL,_8UL>.data_.align_ =
         (type)0x0;
    *(undefined8 *)
     ((long)&(this->m_inner).m_iterator.storage_.super_aligned_storage_imp<32UL,_8UL>.data_ + 0x18)
         = 0;
    goto LAB_001e4fc0;
  }
  p_Var1 = (this->m_end).m_container.
           super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      piVar3 = (this->m_end).m_iterator._M_current;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        goto LAB_001e4f9e;
      }
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
  }
LAB_001e4f9e:
  boost::
  variant<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>
  ::variant(&(this->m_inner).m_iterator,
            &piVar3[-1].
             super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_int_&,_int_*>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End.m_iterator);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
LAB_001e4fc0:
  this->m_items_remaining = 0;
  return;
}

Assistant:

join_iterator_impl (iterator::end_tag_t, const join_iterator_impl & begin):
                m_begin(begin.m_begin),
                m_end(begin.m_end),
                m_outer(m_begin != m_end ? m_end : outer_range_iterator{}),
                m_inner(m_begin != m_end ? boost::prior(m_end)->end() : inner_range_iterator{}),
                m_items_remaining(0)
            {
            }